

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncmp.c
# Opt level: O2

int main(void)

{
  int iVar1;
  ulong in_RAX;
  ulong uStack_8;
  char empty [1];
  
  uStack_8 = in_RAX & 0xffffffffffffff;
  iVar1 = strncmp(empty,"abcde",5);
  if (-1 < iVar1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncmp.c, line %d - %s\n"
           ,0x2e,"strncmp( empty, abcde, 5 ) < 0");
  }
  iVar1 = strncmp("abcde",empty,5);
  if (iVar1 < 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncmp.c, line %d - %s\n"
           ,0x2f,"strncmp( abcde, empty, 5 ) > 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char cmpabcde[] = "abcde\0f";
    char cmpabcd_[] = "abcde\xfc";
    char empty[] = "";
    char x[] = "x";
    TESTCASE( strncmp( abcde, cmpabcde, 5 ) == 0 );
    TESTCASE( strncmp( abcde, cmpabcde, 10 ) == 0 );
    TESTCASE( strncmp( abcde, abcdx, 5 ) < 0 );
    TESTCASE( strncmp( abcdx, abcde, 5 ) > 0 );
    TESTCASE( strncmp( empty, abcde, 5 ) < 0 );
    TESTCASE( strncmp( abcde, empty, 5 ) > 0 );
    TESTCASE( strncmp( abcde, abcdx, 4 ) == 0 );
    TESTCASE( strncmp( abcde, x, 0 ) == 0 );
    TESTCASE( strncmp( abcde, x, 1 ) < 0 );
    TESTCASE( strncmp( abcde, cmpabcd_, 10 ) < 0 );
    return TEST_RESULTS;
}